

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

ALLEGRO_FONT * al_load_ttf_font_stretch(char *filename,int w,int h,int flags)

{
  long lVar1;
  ulong uVar2;
  undefined8 in_RDI;
  ALLEGRO_FONT *font;
  ALLEGRO_FILE *f;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  char *in_stack_000000a0;
  ALLEGRO_FILE *in_stack_000000a8;
  ALLEGRO_FONT *local_8;
  
  lVar1 = al_fopen(in_RDI,"rb");
  if (lVar1 == 0) {
    uVar2 = _al_trace_prefix(__al_debug_channel,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                             ,0x3e2,"al_load_ttf_font_stretch");
    if ((uVar2 & 1) != 0) {
      _al_trace_suffix("Unable to open file for reading: %s\n",in_RDI);
    }
    local_8 = (ALLEGRO_FONT *)0x0;
  }
  else {
    local_8 = al_load_ttf_font_stretch_f
                        (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                         in_stack_00000094);
  }
  return local_8;
}

Assistant:

ALLEGRO_FONT *al_load_ttf_font_stretch(char const *filename, int w, int h,
   int flags)
{
   ALLEGRO_FILE *f;
   ALLEGRO_FONT *font;
   ASSERT(filename);

   f = al_fopen(filename, "rb");
   if (!f) {
      ALLEGRO_ERROR("Unable to open file for reading: %s\n", filename);
      return NULL;
   }

   /* The file handle is owned by the function and the file is usually only
    * closed when the font is destroyed, in case Freetype has to load data
    * at a later time.
    */
   font = al_load_ttf_font_stretch_f(f, filename, w, h, flags);

   return font;
}